

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O1

void wmap(settings_w *sesskey,char *outkey,Conf *conf,int primary,_Bool include_values)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  byte *value;
  byte *__s1;
  byte *pbVar4;
  uint uVar5;
  byte *pbVar6;
  size_t factor1;
  undefined3 in_register_00000081;
  int iVar7;
  byte *pbVar8;
  char *key;
  byte *local_58;
  undefined4 local_4c;
  Conf *local_48;
  settings_w *local_40;
  char *local_38;
  
  local_4c = CONCAT31(in_register_00000081,include_values);
  local_40 = sesskey;
  pcVar1 = conf_get_str_strs(conf,primary,(char *)0x0,(char **)&local_58);
  local_48 = conf;
  local_38 = outkey;
  if (pcVar1 == (char *)0x0) {
    factor1 = 1;
  }
  else {
    iVar7 = 1;
    do {
      pbVar6 = local_58;
      sVar2 = strlen((char *)local_58);
      sVar3 = strlen(pcVar1);
      conf = local_48;
      iVar7 = iVar7 + ((int)sVar3 + (int)sVar2) * 2 + 2;
      pcVar1 = conf_get_str_strs(local_48,primary,(char *)pbVar6,(char **)&local_58);
    } while (pcVar1 != (char *)0x0);
    factor1 = (size_t)iVar7;
  }
  value = (byte *)safemalloc(factor1,1,0);
  __s1 = (byte *)conf_get_str_strs(conf,primary,(char *)0x0,(char **)&local_58);
  pbVar6 = value;
joined_r0x0013ec5e:
  if (__s1 == (byte *)0x0) {
    *pbVar6 = 0;
    write_setting_s(local_40,local_38,(char *)value);
    safefree(value);
    return;
  }
  if ((primary == 0xb0) && (iVar7 = strcmp((char *)__s1,"D"), pbVar8 = local_58, iVar7 == 0)) {
    local_58 = (byte *)dupstr((char *)local_58);
    pcVar1 = strchr((char *)local_58,0x4c);
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = 'D';
    }
    __s1 = (byte *)(anon_var_dwarf_34748 + 10);
  }
  else {
    pbVar8 = (byte *)0x0;
  }
  pbVar4 = local_58;
  if (pbVar6 != value) {
    *pbVar6 = 0x2c;
    pbVar6 = pbVar6 + 1;
  }
  do {
    uVar5 = *pbVar4 - 0x2c;
    if ((uVar5 < 0x31) && ((0x1000000020001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
      *pbVar6 = 0x5c;
      pbVar6 = pbVar6 + 1;
    }
    else if (*pbVar4 == 0) break;
    *pbVar6 = *pbVar4;
    pbVar6 = pbVar6 + 1;
    pbVar4 = pbVar4 + 1;
  } while( true );
  if ((char)local_4c != '\0') {
    *pbVar6 = 0x3d;
    do {
      uVar5 = *__s1 - 0x2c;
      if ((uVar5 < 0x31) && ((0x1000000020001U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
        pbVar6[1] = 0x5c;
        pbVar6 = pbVar6 + 2;
      }
      else {
        pbVar6 = pbVar6 + 1;
        if (*__s1 == 0) break;
      }
      *pbVar6 = *__s1;
      __s1 = __s1 + 1;
    } while( true );
  }
  if (pbVar8 != (byte *)0x0) {
    free(local_58);
    local_58 = pbVar8;
  }
  __s1 = (byte *)conf_get_str_strs(local_48,primary,(char *)local_58,(char **)&local_58);
  goto joined_r0x0013ec5e;
}

Assistant:

static void wmap(settings_w *sesskey, char const *outkey, Conf *conf,
                 int primary, bool include_values)
{
    char *buf, *p, *key, *realkey;
    const char *val, *q;
    int len;

    len = 1;                           /* allow for NUL */

    for (val = conf_get_str_strs(conf, primary, NULL, &key);
         val != NULL;
         val = conf_get_str_strs(conf, primary, key, &key))
        len += 2 + 2 * (strlen(key) + strlen(val));   /* allow for escaping */

    buf = snewn(len, char);
    p = buf;

    for (val = conf_get_str_strs(conf, primary, NULL, &key);
         val != NULL;
         val = conf_get_str_strs(conf, primary, key, &key)) {

        if (primary == CONF_portfwd && !strcmp(val, "D")) {
            /*
             * Backwards-compatibility hack, as above: translate from
             * the sensible internal representation of dynamic
             * forwardings (key "L<port>", value "D") to the
             * conceptually incoherent legacy storage format (key
             * "D<port>", value empty).
             */
            char *L;

            realkey = key;             /* restore it at end of loop */
            val = "";
            key = dupstr(key);
            L = strchr(key, 'L');
            if (L) *L = 'D';
        } else {
            realkey = NULL;
        }

        if (p != buf)
            *p++ = ',';
        for (q = key; *q; q++) {
            if (*q == '=' || *q == ',' || *q == '\\')
                *p++ = '\\';
            *p++ = *q;
        }
        if (include_values) {
            *p++ = '=';
            for (q = val; *q; q++) {
                if (*q == '=' || *q == ',' || *q == '\\')
                    *p++ = '\\';
                *p++ = *q;
            }
        }

        if (realkey) {
            free(key);
            key = realkey;
        }
    }
    *p = '\0';
    write_setting_s(sesskey, outkey, buf);
    sfree(buf);
}